

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.h
# Opt level: O3

cmCommand * __thiscall cmStringCommand::Clone(cmStringCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x30);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00631f30;
  return pcVar1;
}

Assistant:

cmCommand* Clone() override { return new cmStringCommand; }